

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.h
# Opt level: O3

bool __thiscall
SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::is_v6
          (WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this)

{
  error_code ec;
  endpoint_type rt;
  error_code local_48;
  data_union local_34;
  
  local_48._M_value = 0;
  local_48._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
            ((endpoint_type *)&local_34.base,
             (this->Socket).next_layer_.super_basic_socket<asio::ip::tcp>.
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
             service_,&(this->Socket).next_layer_.super_basic_socket<asio::ip::tcp>.
                       super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                       .implementation_,&local_48);
  return local_34.base.sa_family != 2 || local_48._M_value != 0;
}

Assistant:

virtual bool is_v6() const override
        {
            std::error_code ec;
            auto rt(Socket.lowest_layer().remote_endpoint(ec));
            if (!ec)
                return rt.address().is_v6();
            else
                return true;
        }